

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_23008be::RNGState::MixExtract
          (RNGState *this,uchar *out,size_t num,CSHA512 *hasher,bool strong_seed,
          bool always_use_real_rng)

{
  uint64_t *data;
  long lVar1;
  byte bVar2;
  long in_FS_OFFSET;
  Span<std::byte> out_00;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock3;
  uchar buf [64];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (0x20 < num) {
    __assert_fail("num <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/random.cpp"
                  ,0x1e9,
                  "bool (anonymous namespace)::RNGState::MixExtract(unsigned char *, size_t, CSHA512 &&, bool, bool)"
                 );
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock3,&this->m_mutex,"m_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/random.cpp",
             0x1ee,false);
  bVar2 = strong_seed | this->m_strongly_seeded;
  this->m_strongly_seeded = (bool)bVar2;
  CSHA512::Write(hasher,this->m_state,0x20);
  data = &this->m_counter;
  CSHA512::Write(hasher,(uchar *)data,8);
  *data = *data + 1;
  CSHA512::Finalize(hasher,buf);
  *(undefined8 *)(this->m_state + 0x10) = buf._48_8_;
  *(undefined8 *)(this->m_state + 0x18) = buf._56_8_;
  *(undefined8 *)this->m_state = buf._32_8_;
  *(undefined8 *)(this->m_state + 8) = buf._40_8_;
  if ((!always_use_real_rng) &&
     ((this->m_deterministic_prng).super__Optional_base<ChaCha20,_false,_false>._M_payload.
      super__Optional_payload<ChaCha20,_true,_false,_false>.super__Optional_payload_base<ChaCha20>.
      _M_engaged == true)) {
    out_00.m_size = num;
    out_00.m_data = buf;
    ChaCha20::Keystream((ChaCha20 *)&this->m_deterministic_prng,out_00);
    bVar2 = 1;
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock3.super_unique_lock);
  if (num != 0) {
    if (out == (uchar *)0x0) {
      __assert_fail("out != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/random.cpp"
                    ,0x203,
                    "bool (anonymous namespace)::RNGState::MixExtract(unsigned char *, size_t, CSHA512 &&, bool, bool)"
                   );
    }
    memcpy(out,buf,num);
  }
  CSHA512::Reset(hasher);
  memory_cleanse(buf,0x40);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)bVar2;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        assert(num <= 32);
        unsigned char buf[64];
        static_assert(sizeof(buf) == CSHA512::OUTPUT_SIZE, "Buffer needs to have hasher's output size");
        bool ret;
        {
            LOCK(m_mutex);
            ret = (m_strongly_seeded |= strong_seed);
            // Write the current state of the RNG into the hasher
            hasher.Write(m_state, 32);
            // Write a new counter number into the state
            hasher.Write((const unsigned char*)&m_counter, sizeof(m_counter));
            ++m_counter;
            // Finalize the hasher
            hasher.Finalize(buf);
            // Store the last 32 bytes of the hash output as new RNG state.
            memcpy(m_state, buf + 32, 32);
            // Handle requests for deterministic randomness.
            if (!always_use_real_rng && m_deterministic_prng.has_value()) [[unlikely]] {
                // Overwrite the beginning of buf, which will be used for output.
                m_deterministic_prng->Keystream(AsWritableBytes(Span{buf, num}));
                // Do not require strong seeding for deterministic output.
                ret = true;
            }
        }
        // If desired, copy (up to) the first 32 bytes of the hash output as output.
        if (num) {
            assert(out != nullptr);
            memcpy(out, buf, num);
        }
        // Best effort cleanup of internal state
        hasher.Reset();
        memory_cleanse(buf, 64);
        return ret;
    }